

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::DynamicTypeHandler::InvalidateInlineCachesForAllProperties<false>
          (DynamicTypeHandler *this,ScriptContext *requestContext)

{
  uint uVar1;
  int propertyId;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = (*this->_vptr_DynamicTypeHandler[6])();
  if ((int)uVar1 < 0x80) {
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        propertyId = (*this->_vptr_DynamicTypeHandler[8])(this,requestContext,uVar3 & 0xffff);
        if (propertyId != -1) {
          ScriptContext::InvalidateProtoCaches(requestContext,propertyId);
        }
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
      } while (uVar1 != uVar2);
    }
  }
  else {
    ScriptContext::InvalidateAllProtoCaches(requestContext);
  }
  return 0x7f < (int)uVar1;
}

Assistant:

bool DynamicTypeHandler::InvalidateInlineCachesForAllProperties(ScriptContext* requestContext)
    {
        int count = GetPropertyCount();
        if (count < 128) // Invalidate a propertyId involves dictionary lookups. Only do this when the number is relatively small.
        {
            for (int i = 0; i < count; i++)
            {
                PropertyId propertyId = GetPropertyId(requestContext, static_cast<PropertyIndex>(i));
                if (propertyId != Constants::NoProperty)
                {
                    isStoreField ? requestContext->InvalidateStoreFieldCaches(propertyId) : requestContext->InvalidateProtoCaches(propertyId);
                }
            }
            return false;
        }
        else
        {
            isStoreField ? requestContext->InvalidateAllStoreFieldCaches() : requestContext->InvalidateAllProtoCaches();
            return true;
        }
    }